

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringlistmodel.cpp
# Opt level: O1

QMap<int,_QVariant> __thiscall QStringListModel::itemData(QStringListModel *this,QModelIndex *index)

{
  bool bVar1;
  QModelIndex *in_RDX;
  long lVar2;
  long in_FS_OFFSET;
  initializer_list<std::pair<int,_QVariant>_> list;
  pair<int,_QVariant> local_98;
  undefined4 local_70;
  QVariant local_68;
  anon_union_24_3_e3d07ef4_for_data local_48;
  undefined1 *puStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QAbstractItemModel::checkIndex((QAbstractItemModel *)index,in_RDX,(CheckIndexOptions)0x5);
  if (bVar1) {
    local_48._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
    local_48.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    ::QVariant::QVariant
              ((QVariant *)&local_48,(QString *)((long)in_RDX->r * 0x18 + *(long *)(index + 1)));
    local_98.first = 0;
    ::QVariant::QVariant(&local_98.second,(QVariant *)&local_48);
    local_70 = 2;
    ::QVariant::QVariant(&local_68,(QVariant *)&local_48);
    list._M_len = 2;
    list._M_array = &local_98;
    QMap<int,_QVariant>::QMap((QMap<int,_QVariant> *)this,list);
    lVar2 = 0x30;
    do {
      ::QVariant::~QVariant((QVariant *)((long)&local_98.first + lVar2));
      lVar2 = lVar2 + -0x28;
    } while (lVar2 != -0x20);
    ::QVariant::~QVariant((QVariant *)&local_48);
  }
  else {
    *(undefined8 *)this = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
            )(QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
              )this;
  }
  __stack_chk_fail();
}

Assistant:

QMap<int, QVariant> QStringListModel::itemData(const QModelIndex &index) const
{
    if (!checkIndex(index, CheckIndexOption::IndexIsValid | CheckIndexOption::ParentIsInvalid))
        return QMap<int, QVariant>{};
    const QVariant displayData = lst.at(index.row());
    return QMap<int, QVariant>{{
        std::make_pair<int>(Qt::DisplayRole, displayData),
        std::make_pair<int>(Qt::EditRole, displayData)
    }};
}